

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enorm_.c
# Opt level: O2

double enorm_(int *n,double *x)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  uVar2 = *n;
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  dVar6 = 0.0;
  dVar7 = 0.0;
  dVar5 = 0.0;
  dVar10 = 0.0;
  dVar9 = 0.0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = x[uVar4];
    dVar8 = ABS(dVar1);
    if ((dVar8 <= 1.82691291192569e-153) || (1.34078079299426e+153 / (double)(int)uVar2 <= dVar8)) {
      if (dVar8 <= 1.82691291192569e-153) {
        if (dVar8 <= dVar9) {
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            dVar5 = dVar5 + (dVar8 / dVar9) * (dVar8 / dVar9);
          }
        }
        else {
          dVar5 = dVar5 * (dVar9 / dVar8) * (dVar9 / dVar8) + 1.0;
          dVar9 = dVar8;
        }
      }
      else if (dVar8 <= dVar10) {
        dVar6 = dVar6 + (dVar8 / dVar10) * (dVar8 / dVar10);
      }
      else {
        dVar6 = dVar6 * (dVar10 / dVar8) * (dVar10 / dVar8) + 1.0;
        dVar10 = dVar8;
      }
    }
    else {
      dVar7 = dVar7 + dVar1 * dVar1;
    }
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar6 = dVar6 + (dVar7 / dVar10) / dVar10;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar9 = dVar10 * dVar6;
  }
  else if ((dVar7 != 0.0) || (NAN(dVar7))) {
    if (dVar9 <= dVar7) {
      dVar9 = ((dVar9 / dVar7) * dVar5 * dVar9 + 1.0) * dVar7;
      if (dVar9 < 0.0) goto LAB_001015b1;
      dVar9 = SQRT(dVar9);
    }
    else {
      dVar9 = (dVar5 * dVar9 + dVar7 / dVar9) * dVar9;
      if (dVar9 < 0.0) {
LAB_001015b1:
        dVar9 = sqrt(dVar9);
        return dVar9;
      }
      dVar9 = SQRT(dVar9);
    }
  }
  else {
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar9 = dVar9 * dVar5;
  }
  return dVar9;
}

Assistant:

__minpack_attr__
real __minpack_func__(enorm)(const int *n, const real *x)
{
    /* System generated locals */
    int i__1;
    real ret_val, d__1;

    /* Local variables */
    int i__;
    real s1, s2, s3, xabs, x1max, x3max, agiant, floatn;

/*     ********** */

/*     function enorm */

/*     given an n-vector x, this function calculates the */
/*     euclidean norm of x. */

/*     the euclidean norm is computed by accumulating the sum of */
/*     squares in three different sums. the sums of squares for the */
/*     small and large components are scaled so that no overflows */
/*     occur. non-destructive underflows are permitted. underflows */
/*     and overflows do not occur in the computation of the unscaled */
/*     sum of squares for the intermediate components. */
/*     the definitions of small, intermediate and large components */
/*     depend on two constants, rdwarf and rgiant. the main */
/*     restrictions on these constants are that rdwarf**2 not */
/*     underflow and rgiant**2 not overflow. the constants */
/*     given here are suitable for every known computer. */

/*     the function statement is */

/*       double precision function enorm(n,x) */

/*     where */

/*       n is a positive integer input variable. */

/*       x is an input array of length n. */

/*     subprograms called */

/*       fortran-supplied ... dabs,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --x;

    /* Function Body */
    s1 = 0.;
    s2 = 0.;
    s3 = 0.;
    x1max = 0.;
    x3max = 0.;
    floatn = (real) (*n);
    agiant = rgiant / floatn;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	xabs = fabs(x[i__]);
	if (xabs > rdwarf && xabs < agiant) {
	    goto L70;
	}
	if (xabs <= rdwarf) {
	    goto L30;
	}

/*              sum for large components. */

	if (xabs <= x1max) {
	    goto L10;
	}
/* Computing 2nd power */
	d__1 = x1max / xabs;
	s1 = 1 + s1 * (d__1 * d__1);
	x1max = xabs;
	goto L20;
L10:
/* Computing 2nd power */
	d__1 = xabs / x1max;
	s1 += d__1 * d__1;
L20:
	goto L60;
L30:

/*              sum for small components. */

	if (xabs <= x3max) {
	    goto L40;
	}
/* Computing 2nd power */
	d__1 = x3max / xabs;
	s3 = 1 + s3 * (d__1 * d__1);
	x3max = xabs;
	goto L50;
L40:
	if (xabs != 0.) {
/* Computing 2nd power */
	    d__1 = xabs / x3max;
	    s3 += d__1 * d__1;
	}
L50:
L60:
	goto L80;
L70:

/*           sum for intermediate components. */

/* Computing 2nd power */
	d__1 = xabs;
	s2 += d__1 * d__1;
L80:
/* L90: */
	;
    }

/*     calculation of norm. */

    if (s1 == 0.) {
	goto L100;
    }
    ret_val = x1max * sqrt(s1 + s2 / x1max / x1max);
    goto L130;
L100:
    if (s2 == 0.) {
	goto L110;
    }
    if (s2 >= x3max) {
	ret_val = sqrt(s2 * (1 + x3max / s2 * (x3max * s3)));
    } else {
	ret_val = sqrt(x3max * (s2 / x3max + x3max * s3));
    }
    goto L120;
L110:
    ret_val = x3max * sqrt(s3);
L120:
L130:
    return ret_val;

/*     last card of function enorm. */
}